

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O3

void __thiscall cmXMLWriter::PreAttribute(cmXMLWriter *this)

{
  char local_9;
  
  if (this->ElementOpen != false) {
    ConditionalLineBreak(this,this->BreakAttrib);
    if (this->BreakAttrib == false) {
      local_9 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(this->Output,&local_9,1);
    }
    return;
  }
  __assert_fail("this->ElementOpen",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmXMLWriter.cxx"
                ,0x7c,"void cmXMLWriter::PreAttribute()");
}

Assistant:

void cmXMLWriter::PreAttribute()
{
  assert(this->ElementOpen);
  this->ConditionalLineBreak(this->BreakAttrib);
  if (!this->BreakAttrib) {
    this->Output << ' ';
  }
}